

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  _Alloc_hider _Var7;
  int iVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string arg;
  string destination;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  allocator local_205;
  int local_204;
  undefined8 local_200;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  char *local_1d0;
  undefined1 local_1c8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  char *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (argc < 3) {
    std::__cxx11::string::string((string *)&local_50,*argv,(allocator *)&local_1d8);
    show_usage(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return 1;
  }
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8 = local_1c8;
  local_200 = 0;
  local_1d0 = (char *)0x0;
  local_1c8[0] = 0;
  iVar8 = 1;
  bVar2 = true;
  local_204 = argc;
  do {
    std::__cxx11::string::string((string *)local_1f8,argv[iVar8],(allocator *)&local_190);
    iVar4 = std::__cxx11::string::compare((char *)local_1f8);
    if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_1f8), iVar4 == 0)) {
      std::__cxx11::string::string((string *)&local_90,*argv,(allocator *)&local_190);
      show_usage(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      local_200 = 0;
LAB_00103729:
      bVar3 = false;
      iVar4 = iVar8;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)local_1f8);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_1f8), iVar4 == 0)) {
        if (argc == 3) {
          std::__cxx11::string::string((string *)&local_b0,*argv,(allocator *)&local_190);
          show_usage(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
        }
        else {
          iVar4 = iVar8 + 1;
          if (iVar4 < argc) {
            __s = argv[iVar4];
            local_198 = local_1d0;
            strlen(__s);
            bVar3 = true;
            std::__cxx11::string::_M_replace((ulong)&local_1d8,0,local_198,(ulong)__s);
            argc = local_204;
            goto LAB_0010372c;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"--type option needs one argument.",0x21);
          argc = local_204;
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
          std::ostream::put('H');
          std::ostream::flush();
        }
        local_200 = 1;
        goto LAB_00103729;
      }
      std::__cxx11::string::string((string *)&local_190,argv[iVar8],&local_205);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
                 &local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      bVar3 = true;
      iVar4 = iVar8;
    }
LAB_0010372c:
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0]);
    }
    if (!bVar3) break;
    iVar8 = iVar4 + 1;
    bVar2 = iVar8 < argc;
  } while (iVar8 < argc);
  iVar8 = (int)local_200;
  if (!bVar2) {
    iVar8 = std::__cxx11::string::compare((char *)&local_1d8);
    if (((iVar8 == 0) ||
        ((long)local_1b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_1b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 0x20)) ||
       ((iVar8 = std::__cxx11::string::compare((char *)&local_1d8), iVar8 != 0 &&
        (((iVar8 = std::__cxx11::string::compare((char *)&local_1d8), iVar8 != 0 &&
          (iVar8 = std::__cxx11::string::compare((char *)&local_1d8), iVar8 != 0)) &&
         (iVar8 = std::__cxx11::string::compare((char *)&local_1d8), iVar8 != 0)))))) {
      std::__cxx11::string::string((string *)&local_70,*argv,(allocator *)local_1f8);
      show_usage(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      iVar8 = 1;
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)&local_1d8);
      if (iVar8 == 0) {
        paVar9 = &local_d0.field_2;
        pcVar1 = ((local_1b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        local_d0._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar1,
                   pcVar1 + (local_1b8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        encode(&local_d0);
        _Var7._M_p = local_d0._M_dataplus._M_p;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_1d8);
        if (iVar8 != 0) {
          iVar8 = std::__cxx11::string::compare((char *)&local_1d8);
          if (iVar8 == 0) {
            pcVar1 = ((local_1b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,pcVar1,
                       pcVar1 + (local_1b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
            encode(&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            std::__cxx11::string::substr
                      ((ulong)local_1f8,
                       (ulong)local_1b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            plVar5 = (long *)std::__cxx11::string::append((char *)local_1f8);
            paVar9 = &local_150.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_150.field_2._M_allocated_capacity = *psVar6;
              local_150.field_2._8_8_ = plVar5[3];
              local_150._M_dataplus._M_p = (pointer)paVar9;
            }
            else {
              local_150.field_2._M_allocated_capacity = *psVar6;
              local_150._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_150._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            decode(&local_150);
            _Var7._M_p = local_150._M_dataplus._M_p;
          }
          else {
            pcVar1 = ((local_1b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,pcVar1,
                       pcVar1 + (local_1b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
            encodeImagePackBits(&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p);
            }
            std::__cxx11::string::substr
                      ((ulong)local_1f8,
                       (ulong)local_1b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            plVar5 = (long *)std::__cxx11::string::append((char *)local_1f8);
            paVar9 = &local_170.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_170.field_2._M_allocated_capacity = *psVar6;
              local_170.field_2._8_8_ = plVar5[3];
              local_170._M_dataplus._M_p = (pointer)paVar9;
            }
            else {
              local_170.field_2._M_allocated_capacity = *psVar6;
              local_170._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_170._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            decodeImagePackBits(&local_170);
            _Var7._M_p = local_170._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var7._M_p != paVar9) {
            operator_delete(_Var7._M_p);
          }
          if (local_1f8[0] != local_1e8) {
            operator_delete(local_1f8[0]);
          }
          iVar8 = 0;
          goto LAB_00103827;
        }
        paVar9 = &local_f0.field_2;
        pcVar1 = ((local_1b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        local_f0._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar1,
                   pcVar1 + (local_1b8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        decode(&local_f0);
        _Var7._M_p = local_f0._M_dataplus._M_p;
      }
      iVar8 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != paVar9) {
        operator_delete(_Var7._M_p);
      }
    }
  }
LAB_00103827:
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  return iVar8;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 3)
    {
        show_usage(argv[0]);
        return 1;
    }
    std::vector <std::string> sources;
    std::string destination;

    for (int i = 1; i < argc; ++i) {
        std::string arg = argv[i];
        if ((arg == "-h") || (arg == "--help")) {
            show_usage(argv[0]);
            return 0;
        } else if ((arg == "-t") || (arg == "--type")) {
            if (argc < 4)
            {
                show_usage(argv[0]);
                return 1;
            }
            if (i + 1 < argc) {                                     // Make sure we aren't at the end of argv!
                destination = argv[++i];
            } else {
                  std::cerr << "--type option needs one argument." << std::endl;
                return 1;
            }
        } else {
            sources.push_back(argv[i]);
        }
    }
    if (destination == "" || sources.size() != 1 || (destination != "0" && destination != "1" && destination != "2" && destination != "3"))
    {
        show_usage(argv[0]);
        return 1;
    }
    /*
    0 - encode image
    1 - decode image
    2 - encode and decode image
    3 - encode and decode image with the PackBits algorithm
    */
    if (destination == "0")
            encode(sources[0]);
    else if (destination == "1")
            decode(sources[0]);
    else if (destination == "2")
    {
        encode(sources[0]);
        decode(sources[0].substr(0, sources[0].size()-4) + ".rle");
    }
    else
    {
        encodeImagePackBits(sources[0]);
        decodeImagePackBits(sources[0].substr(0, sources[0].size()-4) + "_packbits.rle");
    }

    return 0;
}